

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O2

void sf_unescape(sf_vec *dest,sf_vec *src)

{
  void *pvVar1;
  uint8_t *__s;
  size_t __n;
  size_t sVar2;
  uint8_t *puVar3;
  uint8_t *__dest;
  
  sVar2 = src->len;
  if (sVar2 == 0) {
    sVar2 = src->len;
    dest->base = src->base;
    dest->len = sVar2;
  }
  else {
    __dest = dest->base;
    __s = src->base;
    while( true ) {
      pvVar1 = memchr(__s,0x5c,sVar2);
      if (pvVar1 == (void *)0x0) break;
      __n = (long)pvVar1 - (long)__s;
      memcpy(__dest,__s,__n);
      __s = (uint8_t *)((long)pvVar1 + 2);
      puVar3 = __dest + __n;
      __dest = puVar3 + 1;
      *puVar3 = *(uint8_t *)((long)pvVar1 + 1);
      sVar2 = (sVar2 - __n) - 2;
    }
    if (sVar2 == src->len) {
      sVar2 = src->len;
      dest->base = src->base;
      dest->len = sVar2;
    }
    else {
      memcpy(__dest,__s,sVar2);
      dest->len = (size_t)(__dest + (sVar2 - (long)dest->base));
    }
  }
  return;
}

Assistant:

void sf_unescape(sf_vec *dest, const sf_vec *src) {
  const uint8_t *p, *q;
  uint8_t *o;
  size_t len, slen;

  if (src->len == 0) {
    *dest = *src;

    return;
  }

  o = dest->base;
  p = src->base;
  len = src->len;

  for (;;) {
    q = memchr(p, '\\', len);
    if (q == NULL) {
      if (len == src->len) {
        *dest = *src;

        return;
      }

      memcpy(o, p, len);
      o += len;

      break;
    }

    slen = (size_t)(q - p);
    memcpy(o, p, slen);
    o += slen;

    p = q + 1;
    *o++ = *p++;
    len -= slen + 2;
  }

  dest->len = (size_t)(o - dest->base);
}